

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_9195::verifyLevelsAreEqual
               (FlatImageLevel *level1,FlatImageLevel *level2,int dx,int dy)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Box2i *pBVar6;
  ArgExc *pAVar7;
  ostream *poVar8;
  string *psVar9;
  FlatImageChannel *pFVar10;
  int in_ECX;
  int in_EDX;
  ImageLevel *in_RSI;
  ImageLevel *in_RDI;
  ConstIterator i2;
  ConstIterator i1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  bool local_e1;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  FlatImageChannel *in_stack_ffffffffffffff70;
  bool local_71;
  
  pBVar6 = Imf_3_2::ImageLevel::dataWindow(in_RDI);
  iVar3 = (pBVar6->min).x;
  pBVar6 = Imf_3_2::ImageLevel::dataWindow(in_RSI);
  if (iVar3 == (pBVar6->min).x - in_EDX) {
    pBVar6 = Imf_3_2::ImageLevel::dataWindow(in_RDI);
    iVar3 = (pBVar6->min).y;
    pBVar6 = Imf_3_2::ImageLevel::dataWindow(in_RSI);
    if (iVar3 == (pBVar6->min).y - in_ECX) {
      pBVar6 = Imf_3_2::ImageLevel::dataWindow(in_RDI);
      iVar3 = (pBVar6->max).x;
      pBVar6 = Imf_3_2::ImageLevel::dataWindow(in_RSI);
      if (iVar3 == (pBVar6->max).x - in_EDX) {
        pBVar6 = Imf_3_2::ImageLevel::dataWindow(in_RDI);
        iVar3 = (pBVar6->max).y;
        pBVar6 = Imf_3_2::ImageLevel::dataWindow(in_RSI);
        if (iVar3 == (pBVar6->max).y - in_ECX) {
          Imf_3_2::FlatImageLevel::begin();
          Imf_3_2::FlatImageLevel::begin();
          while( true ) {
            Imf_3_2::FlatImageLevel::end();
            bVar1 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffff10,
                                        (ConstIterator *)in_stack_ffffffffffffff08);
            local_71 = false;
            if (bVar1) {
              Imf_3_2::FlatImageLevel::end();
              local_71 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffff10,
                                             (ConstIterator *)in_stack_ffffffffffffff08);
            }
            if (local_71 == false) {
              Imf_3_2::FlatImageLevel::end();
              bVar1 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffff10,
                                          (ConstIterator *)in_stack_ffffffffffffff08);
              local_e1 = true;
              if (!bVar1) {
                Imf_3_2::FlatImageLevel::end();
                local_e1 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffff10,
                                               (ConstIterator *)in_stack_ffffffffffffff08);
              }
              if (local_e1 != false) {
                pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_2::ArgExc::ArgExc(pAVar7,"different channel lists");
                __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
              }
              return;
            }
            poVar8 = std::operator<<((ostream *)&std::cout,"            channel ");
            psVar9 = Imf_3_2::FlatImageLevel::ConstIterator::name_abi_cxx11_
                               ((ConstIterator *)0x10c80a);
            poVar8 = std::operator<<(poVar8,(string *)psVar9);
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            Imf_3_2::FlatImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x10c833);
            Imf_3_2::FlatImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x10c845);
            bVar1 = std::operator!=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            if (bVar1) {
              pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(pAVar7,"different channel names");
              __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
            }
            pFVar10 = Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10c8c3);
            iVar3 = (*(code *)**(undefined8 **)pFVar10)();
            pFVar10 = Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10c8dc);
            iVar4 = (*(code *)**(undefined8 **)pFVar10)();
            if (iVar3 != iVar4) {
              pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(pAVar7,"different channel types");
              __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
            }
            pFVar10 = Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10c959);
            iVar4 = Imf_3_2::ImageChannel::xSampling((ImageChannel *)pFVar10);
            pFVar10 = Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10c972);
            iVar5 = Imf_3_2::ImageChannel::xSampling((ImageChannel *)pFVar10);
            if (iVar4 != iVar5) break;
            pFVar10 = Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10c991);
            iVar4 = Imf_3_2::ImageChannel::ySampling((ImageChannel *)pFVar10);
            pFVar10 = Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10c9aa);
            iVar5 = Imf_3_2::ImageChannel::ySampling((ImageChannel *)pFVar10);
            if (iVar4 != iVar5) break;
            pFVar10 = Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10ca27);
            bVar1 = Imf_3_2::ImageChannel::pLinear((ImageChannel *)pFVar10);
            pFVar10 = Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10ca45);
            bVar2 = Imf_3_2::ImageChannel::pLinear((ImageChannel *)pFVar10);
            if (bVar1 != bVar2) {
              pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(pAVar7,"different channel types");
              __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
            }
            pFVar10 = Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10cac8);
            iVar4 = (*(code *)**(undefined8 **)pFVar10)();
            if (iVar4 == 0) {
              Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10cb84);
              Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10cb96);
              verifyPixelsAreEqual<unsigned_int>
                        (in_stack_ffffffffffffff70,
                         (FlatImageChannel *)CONCAT44(iVar3,in_stack_ffffffffffffff68),
                         (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                         (int)in_stack_ffffffffffffff60);
            }
            else if (iVar4 == 1) {
              Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10cb09);
              Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10cb1b);
              verifyPixelsAreEqual<Imath_3_2::half>
                        (in_stack_ffffffffffffff70,
                         (FlatImageChannel *)CONCAT44(iVar3,in_stack_ffffffffffffff68),
                         (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                         (int)in_stack_ffffffffffffff60);
            }
            else {
              if (iVar4 != 2) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testFlatImage.cpp"
                              ,0x66,
                              "void (anonymous namespace)::verifyLevelsAreEqual(const FlatImageLevel &, const FlatImageLevel &, int, int)"
                             );
              }
              Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10cb48);
              Imf_3_2::FlatImageLevel::ConstIterator::channel((ConstIterator *)0x10cb5a);
              verifyPixelsAreEqual<float>
                        (in_stack_ffffffffffffff70,
                         (FlatImageChannel *)CONCAT44(iVar3,in_stack_ffffffffffffff68),
                         (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                         (int)in_stack_ffffffffffffff60);
            }
            Imf_3_2::FlatImageLevel::ConstIterator::operator++
                      ((ConstIterator *)in_stack_ffffffffffffff10);
            Imf_3_2::FlatImageLevel::ConstIterator::operator++
                      ((ConstIterator *)in_stack_ffffffffffffff10);
          }
          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar7,"different channel sampling rates");
          __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
      }
    }
  }
  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar7,"different data windows");
  __cxa_throw(pAVar7,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
verifyLevelsAreEqual (
    const FlatImageLevel& level1, const FlatImageLevel& level2, int dx, int dy)
{
    if (level1.dataWindow ().min.x != level2.dataWindow ().min.x - dx ||
        level1.dataWindow ().min.y != level2.dataWindow ().min.y - dy ||
        level1.dataWindow ().max.x != level2.dataWindow ().max.x - dx ||
        level1.dataWindow ().max.y != level2.dataWindow ().max.y - dy)
    {
        throw ArgExc ("different data windows");
    }

    FlatImageLevel::ConstIterator i1 = level1.begin ();
    FlatImageLevel::ConstIterator i2 = level2.begin ();

    while (i1 != level1.end () && i2 != level2.end ())
    {
        cout << "            channel " << i1.name () << endl;

        if (i1.name () != i2.name ()) throw ArgExc ("different channel names");

        if (i1.channel ().pixelType () != i2.channel ().pixelType ())
            throw ArgExc ("different channel types");

        if (i1.channel ().xSampling () != i2.channel ().xSampling () ||
            i1.channel ().ySampling () != i2.channel ().ySampling ())
            throw ArgExc ("different channel sampling rates");

        if (i1.channel ().pLinear () != i2.channel ().pLinear ())
            throw ArgExc ("different channel types");

        switch (i1.channel ().pixelType ())
        {
            case HALF:

                verifyPixelsAreEqual<half> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case FLOAT:

                verifyPixelsAreEqual<float> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case UINT:

                verifyPixelsAreEqual<unsigned int> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            default: assert (false);
        }

        ++i1;
        ++i2;
    }

    if (i1 != level1.end () || i2 != level2.end ())
        throw ArgExc ("different channel lists");
}